

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapepiram.cpp
# Opt level: O0

void pzshape::TPZShapePiram::Shape
               (TPZVec<double> *pt,TPZVec<long> *id,TPZVec<int> *order,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  long lVar5;
  int *piVar6;
  double *pdVar7;
  long *plVar8;
  int64_t iVar9;
  TPZVec<int> *in_RDX;
  TPZVec<long> *in_RSI;
  double dVar10;
  int xj_2;
  TPZFNMatrix<40,_double> dphin;
  TPZFNMatrix<40,_double> phin;
  int i;
  int nshape;
  int xj_1;
  int i_3;
  int c;
  int transid;
  int i_2;
  TPZManVector<long,_10> ids_1;
  TPZFNMatrix<60,_double> dphin_2;
  TPZFNMatrix<60,_double> phin_2;
  int nshape_2;
  int ord1;
  TPZManVector<double,_2> outval_1;
  int face;
  int xj;
  int i_1;
  TPZFMatrix<double> dphin_1;
  TPZFMatrix<double> phin_1;
  int nshape_1;
  REAL store2 [60];
  REAL store1 [20];
  int id1;
  int id0;
  TPZManVector<double,_1> outvalvec;
  TPZVec<long> ids;
  REAL outval;
  int rib;
  int shape;
  TPZFNMatrix<100,_double> dphiblend;
  TPZFNMatrix<100,_double> phiblend;
  int d;
  int is;
  bool linear;
  TPZVec<long> *in_stack_ffffffffffffe818;
  TPZFMatrix<double> *in_stack_ffffffffffffe820;
  TPZFMatrix<double> *in_stack_ffffffffffffe828;
  _func_int **pp_Var11;
  TPZFMatrix<double> *in_stack_ffffffffffffe830;
  double in_stack_ffffffffffffe838;
  TPZFNMatrix<100,_double> *in_stack_ffffffffffffe840;
  TPZFMatrix<double> *in_stack_ffffffffffffe848;
  TPZManVector<long,_10> *in_stack_ffffffffffffe850;
  int64_t in_stack_ffffffffffffe860;
  double *in_stack_ffffffffffffe868;
  TPZVec<double> *in_stack_ffffffffffffe870;
  TPZFMatrix<double> *in_stack_ffffffffffffe878;
  TPZFMatrix<double> *in_stack_ffffffffffffe880;
  TPZVec<long> *in_stack_ffffffffffffe888;
  TPZFMatrix<double> *in_stack_ffffffffffffe940;
  TPZFMatrix<double> *in_stack_ffffffffffffe948;
  TPZVec<double> *in_stack_ffffffffffffe950;
  int local_1544;
  TPZFMatrix<double> *in_stack_ffffffffffffebe0;
  TPZFMatrix<double> *in_stack_ffffffffffffebe8;
  TPZVec<double> *in_stack_ffffffffffffebf0;
  int in_stack_ffffffffffffee44;
  TPZFMatrix<double> *in_stack_ffffffffffffee48;
  TPZFMatrix<double> *in_stack_ffffffffffffee50;
  int in_stack_ffffffffffffee5c;
  TPZVec<double> *in_stack_ffffffffffffee60;
  int local_118c;
  int local_1188;
  int local_1184;
  int local_1180;
  int local_1174;
  TPZVec<long> local_1170 [3];
  TPZBaseMatrix local_1100 [13];
  TPZFMatrix<double> *in_stack_fffffffffffff0a8;
  TPZFMatrix<double> *in_stack_fffffffffffff0b0;
  int in_stack_fffffffffffff0bc;
  TPZVec<double> *in_stack_fffffffffffff0c0;
  int local_c0c;
  TPZVec<double> local_c00;
  int local_bcc;
  int local_bc8;
  int local_bc4;
  int in_stack_fffffffffffff524;
  TPZFMatrix<double> *in_stack_fffffffffffff528;
  TPZFMatrix<double> *in_stack_fffffffffffff530;
  int in_stack_fffffffffffff53c;
  TPZVec<double> *in_stack_fffffffffffff540;
  TPZVec<long> local_7e8;
  int local_7bc;
  int local_7b8;
  int local_34;
  int local_30;
  byte local_29;
  TPZVec<int> *local_18;
  TPZVec<long> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  pztopology::TPZPyramid::CornerShape
            (in_stack_ffffffffffffe950,in_stack_ffffffffffffe948,in_stack_ffffffffffffe940);
  local_29 = 1;
  for (local_30 = 5; local_30 < 0x13; local_30 = local_30 + 1) {
    piVar6 = TPZVec<int>::operator[](local_18,(long)local_30 + -5);
    if (1 < *piVar6) {
      local_29 = 0;
    }
  }
  if ((local_29 & 1) == 0) {
    TPZFNMatrix<100,_double>::TPZFNMatrix
              (in_stack_ffffffffffffe840,(int64_t)in_stack_ffffffffffffe838,
               (int64_t)in_stack_ffffffffffffe830);
    TPZFNMatrix<100,_double>::TPZFNMatrix
              (in_stack_ffffffffffffe840,(int64_t)in_stack_ffffffffffffe838,
               (int64_t)in_stack_ffffffffffffe830);
    for (local_30 = 0; local_30 < 5; local_30 = local_30 + 1) {
      pdVar7 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffe840->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffe838,(int64_t)in_stack_ffffffffffffe830);
      dVar10 = *pdVar7;
      pdVar7 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffe840->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffe838,(int64_t)in_stack_ffffffffffffe830);
      *pdVar7 = dVar10;
      for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
        pdVar7 = TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffe840->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffe838,(int64_t)in_stack_ffffffffffffe830);
        dVar10 = *pdVar7;
        pdVar7 = TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffe840->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffe838,(int64_t)in_stack_ffffffffffffe830);
        *pdVar7 = dVar10;
      }
    }
    ShapeGenerating(in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8,in_stack_ffffffffffffebe0);
    local_7b8 = 5;
    for (local_7bc = 0; local_7bc < 8; local_7bc = local_7bc + 1) {
      piVar6 = TPZVec<int>::operator[](local_18,(long)local_7bc);
      if (1 < *piVar6) {
        ProjectPoint3dPiramToRib
                  ((int)((ulong)in_stack_ffffffffffffe850 >> 0x20),
                   (TPZVec<double> *)in_stack_ffffffffffffe848,(REAL *)in_stack_ffffffffffffe840);
        TPZVec<long>::TPZVec
                  ((TPZVec<long> *)in_stack_ffffffffffffe820,(int64_t)in_stack_ffffffffffffe818);
        TPZManVector<double,_1>::TPZManVector
                  ((TPZManVector<double,_1> *)in_stack_ffffffffffffe850,
                   (int64_t)in_stack_ffffffffffffe848,(double *)in_stack_ffffffffffffe840);
        iVar4 = pztopology::TPZPyramid::SideNodes[local_7bc][1];
        plVar8 = TPZVec<long>::operator[]
                           (local_10,(long)pztopology::TPZPyramid::SideNodes[local_7bc][0]);
        lVar5 = *plVar8;
        plVar8 = TPZVec<long>::operator[](&local_7e8,0);
        *plVar8 = lVar5;
        plVar8 = TPZVec<long>::operator[](local_10,(long)iVar4);
        lVar5 = *plVar8;
        plVar8 = TPZVec<long>::operator[](&local_7e8,1);
        *plVar8 = lVar5;
        piVar6 = TPZVec<int>::operator[](local_18,(long)local_7bc);
        iVar4 = *piVar6;
        TPZFMatrix<double>::TPZFMatrix
                  (in_stack_ffffffffffffe880,(int64_t)in_stack_ffffffffffffe878,
                   (int64_t)in_stack_ffffffffffffe870,in_stack_ffffffffffffe868,
                   in_stack_ffffffffffffe860);
        TPZFMatrix<double>::TPZFMatrix
                  (in_stack_ffffffffffffe880,(int64_t)in_stack_ffffffffffffe878,
                   (int64_t)in_stack_ffffffffffffe870,in_stack_ffffffffffffe868,
                   in_stack_ffffffffffffe860);
        TPZFMatrix<double>::Zero(in_stack_ffffffffffffe820);
        TPZFMatrix<double>::Zero(in_stack_ffffffffffffe820);
        TPZVec<int>::operator[](local_18,(long)local_7bc);
        TPZShapeLinear::GetTransformId1d(in_stack_ffffffffffffe818);
        TPZShapeLinear::ShapeInternal
                  ((TPZVec<double> *)in_stack_ffffffffffffe840,
                   (int)((ulong)in_stack_ffffffffffffe838 >> 0x20),in_stack_ffffffffffffe830,
                   in_stack_ffffffffffffe828,(int)((ulong)in_stack_ffffffffffffe820 >> 0x20));
        TransformDerivativeFromRibToPiram
                  ((int)((ulong)in_stack_ffffffffffffe850 >> 0x20),(int)in_stack_ffffffffffffe850,
                   in_stack_ffffffffffffe848);
        for (local_bc4 = 0; local_bc4 < iVar4 + -1; local_bc4 = local_bc4 + 1) {
          pdVar7 = TPZFMatrix<double>::operator()
                             (&in_stack_ffffffffffffe840->super_TPZFMatrix<double>,
                              (int64_t)in_stack_ffffffffffffe838,(int64_t)in_stack_ffffffffffffe830)
          ;
          dVar10 = *pdVar7;
          pdVar7 = TPZFMatrix<double>::operator()
                             (&in_stack_ffffffffffffe840->super_TPZFMatrix<double>,
                              (int64_t)in_stack_ffffffffffffe838,(int64_t)in_stack_ffffffffffffe830)
          ;
          dVar1 = *pdVar7;
          pdVar7 = TPZFMatrix<double>::operator()
                             (&in_stack_ffffffffffffe840->super_TPZFMatrix<double>,
                              (int64_t)in_stack_ffffffffffffe838,(int64_t)in_stack_ffffffffffffe830)
          ;
          *pdVar7 = dVar10 * dVar1;
          for (local_bc8 = 0; local_bc8 < 3; local_bc8 = local_bc8 + 1) {
            pdVar7 = TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe840->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe838,
                                (int64_t)in_stack_ffffffffffffe830);
            dVar10 = *pdVar7;
            pdVar7 = TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe840->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe838,
                                (int64_t)in_stack_ffffffffffffe830);
            dVar1 = *pdVar7;
            pdVar7 = TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe840->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe838,
                                (int64_t)in_stack_ffffffffffffe830);
            dVar2 = *pdVar7;
            pdVar7 = TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe840->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe838,
                                (int64_t)in_stack_ffffffffffffe830);
            dVar3 = *pdVar7;
            pdVar7 = TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe840->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe838,
                                (int64_t)in_stack_ffffffffffffe830);
            *pdVar7 = dVar10 * dVar1 + dVar2 * dVar3;
          }
          local_7b8 = local_7b8 + 1;
        }
        TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1881347);
        TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1881354);
        TPZManVector<double,_1>::~TPZManVector((TPZManVector<double,_1> *)in_stack_ffffffffffffe820)
        ;
        TPZVec<long>::~TPZVec((TPZVec<long> *)in_stack_ffffffffffffe820);
      }
    }
    for (local_bcc = 0; local_bcc < 5; local_bcc = local_bcc + 1) {
      piVar6 = TPZVec<int>::operator[](local_18,(long)(local_bcc + 8));
      if ((1 < *piVar6) &&
         ((local_bcc < 1 ||
          (piVar6 = TPZVec<int>::operator[](local_18,(long)(local_bcc + 8)), 2 < *piVar6)))) {
        TPZManVector<double,_2>::TPZManVector
                  ((TPZManVector<double,_2> *)in_stack_ffffffffffffe840,
                   (int64_t)in_stack_ffffffffffffe838);
        ProjectPoint3dPiramToFace
                  ((int)((ulong)in_stack_ffffffffffffe880 >> 0x20),
                   (TPZVec<double> *)in_stack_ffffffffffffe878,in_stack_ffffffffffffe870);
        piVar6 = TPZVec<int>::operator[](local_18,(long)(local_bcc + 8));
        iVar4 = *piVar6;
        if ((local_bcc == 0) || (2 < iVar4)) {
          if (local_bcc == 0) {
            local_c0c = (iVar4 + -1) * (iVar4 + -1);
          }
          else {
            local_c0c = ((iVar4 + -2) * (iVar4 + -1)) / 2;
          }
          TPZFNMatrix<60,_double>::TPZFNMatrix
                    ((TPZFNMatrix<60,_double> *)in_stack_ffffffffffffe840,
                     (int64_t)in_stack_ffffffffffffe838,(int64_t)in_stack_ffffffffffffe830);
          TPZFNMatrix<60,_double>::TPZFNMatrix
                    ((TPZFNMatrix<60,_double> *)in_stack_ffffffffffffe840,
                     (int64_t)in_stack_ffffffffffffe838,(int64_t)in_stack_ffffffffffffe830);
          TPZFMatrix<double>::Zero(in_stack_ffffffffffffe820);
          TPZFMatrix<double>::Zero(in_stack_ffffffffffffe820);
          TPZManVector<long,_10>::TPZManVector
                    ((TPZManVector<long,_10> *)in_stack_ffffffffffffe840,
                     (int64_t)in_stack_ffffffffffffe838);
          if (local_bcc == 0) {
            for (local_1174 = 0; local_1174 < 4; local_1174 = local_1174 + 1) {
              plVar8 = TPZVec<long>::operator[]
                                 (local_10,(long)pztopology::TPZPyramid::FaceNodes[local_bcc]
                                                 [local_1174]);
              lVar5 = *plVar8;
              plVar8 = TPZVec<long>::operator[](local_1170,(long)local_1174);
              *plVar8 = lVar5;
            }
          }
          else {
            for (local_1174 = 0; local_1174 < 3; local_1174 = local_1174 + 1) {
              plVar8 = TPZVec<long>::operator[]
                                 (local_10,(long)pztopology::TPZPyramid::FaceNodes[local_bcc]
                                                 [local_1174]);
              lVar5 = *plVar8;
              plVar8 = TPZVec<long>::operator[](local_1170,(long)local_1174);
              *plVar8 = lVar5;
            }
          }
          if (local_bcc == 0) {
            TPZShapeQuad::GetTransformId2dQ(in_stack_ffffffffffffe888);
            TPZShapeQuad::ShapeInternal
                      (in_stack_ffffffffffffee60,in_stack_ffffffffffffee5c,in_stack_ffffffffffffee50
                       ,in_stack_ffffffffffffee48,in_stack_ffffffffffffee44);
          }
          else {
            TPZManVector<long,_10>::Resize
                      (in_stack_ffffffffffffe850,(int64_t)in_stack_ffffffffffffe848);
            TPZShapeTriang::GetTransformId2dT((TPZVec<long> *)in_stack_ffffffffffffe848);
            pdVar7 = TPZVec<double>::operator[](&local_c00,0);
            dVar10 = *pdVar7;
            pdVar7 = TPZVec<double>::operator[](&local_c00,0);
            *pdVar7 = (dVar10 + 1.0) * 0.5;
            pdVar7 = TPZVec<double>::operator[](&local_c00,1);
            dVar10 = (*pdVar7 + 1.0) * 0.5;
            pdVar7 = TPZVec<double>::operator[](&local_c00,1);
            *pdVar7 = dVar10;
            TPZShapeTriang::ShapeInternal
                      (in_stack_fffffffffffff540,in_stack_fffffffffffff53c,in_stack_fffffffffffff530
                       ,in_stack_fffffffffffff528,in_stack_fffffffffffff524);
            iVar9 = TPZBaseMatrix::Cols(local_1100);
            for (local_1180 = 0; local_1180 < (int)iVar9; local_1180 = local_1180 + 1) {
              pdVar7 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffe840->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffe838,
                                  (int64_t)in_stack_ffffffffffffe830);
              *pdVar7 = *pdVar7 * 0.5;
              pdVar7 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffe840->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffe838,
                                  (int64_t)in_stack_ffffffffffffe830);
              *pdVar7 = *pdVar7 * 0.5;
              pdVar7 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffe840->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffe838,
                                  (int64_t)in_stack_ffffffffffffe830);
              *pdVar7 = *pdVar7 / 2.0;
            }
          }
          TransformDerivativeFromFaceToPiram
                    ((int)((ulong)in_stack_ffffffffffffe880 >> 0x20),(int)in_stack_ffffffffffffe880,
                     in_stack_ffffffffffffe878);
          for (local_1174 = 0; local_1174 < local_c0c; local_1174 = local_1174 + 1) {
            pdVar7 = TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe840->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe838,
                                (int64_t)in_stack_ffffffffffffe830);
            dVar10 = *pdVar7;
            pdVar7 = TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe840->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe838,
                                (int64_t)in_stack_ffffffffffffe830);
            dVar1 = *pdVar7;
            pdVar7 = TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe840->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe838,
                                (int64_t)in_stack_ffffffffffffe830);
            *pdVar7 = dVar10 * dVar1;
            for (local_1184 = 0; local_1184 < 3; local_1184 = local_1184 + 1) {
              pdVar7 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffe840->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffe838,
                                  (int64_t)in_stack_ffffffffffffe830);
              dVar10 = *pdVar7;
              pdVar7 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffe840->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffe838,
                                  (int64_t)in_stack_ffffffffffffe830);
              dVar1 = *pdVar7;
              pdVar7 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffe840->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffe838,
                                  (int64_t)in_stack_ffffffffffffe830);
              dVar2 = *pdVar7;
              pdVar7 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffe840->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffe838,
                                  (int64_t)in_stack_ffffffffffffe830);
              dVar3 = *pdVar7;
              pdVar7 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffe840->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffe838,
                                  (int64_t)in_stack_ffffffffffffe830);
              *pdVar7 = dVar10 * dVar1 + dVar2 * dVar3;
            }
            local_7b8 = local_7b8 + 1;
          }
          TPZManVector<long,_10>::~TPZManVector((TPZManVector<long,_10> *)in_stack_ffffffffffffe820)
          ;
          TPZFNMatrix<60,_double>::~TPZFNMatrix((TPZFNMatrix<60,_double> *)0x1881cfa);
          TPZFNMatrix<60,_double>::~TPZFNMatrix((TPZFNMatrix<60,_double> *)0x1881d07);
        }
        TPZManVector<double,_2>::~TPZManVector((TPZManVector<double,_2> *)in_stack_ffffffffffffe820)
        ;
      }
    }
    piVar6 = TPZVec<int>::operator[](local_18,0xd);
    if (2 < *piVar6) {
      local_1188 = 0;
      for (local_118c = 0; piVar6 = TPZVec<int>::operator[](local_18,0xd), local_118c < *piVar6 + -2
          ; local_118c = local_118c + 1) {
        local_1188 = ((local_118c + 1) * (local_118c + 2)) / 2 + local_1188;
      }
      TPZFNMatrix<40,_double>::TPZFNMatrix
                ((TPZFNMatrix<40,_double> *)in_stack_ffffffffffffe840,
                 (int64_t)in_stack_ffffffffffffe838,(int64_t)in_stack_ffffffffffffe830);
      TPZFNMatrix<40,_double>::TPZFNMatrix
                ((TPZFNMatrix<40,_double> *)in_stack_ffffffffffffe840,
                 (int64_t)in_stack_ffffffffffffe838,(int64_t)in_stack_ffffffffffffe830);
      TPZFMatrix<double>::Zero(in_stack_ffffffffffffe820);
      TPZFMatrix<double>::Zero(in_stack_ffffffffffffe820);
      TPZVec<int>::operator[](local_18,0xd);
      ShapeInternal(in_stack_fffffffffffff0c0,in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b0,
                    in_stack_fffffffffffff0a8);
      for (local_118c = 0; local_118c < local_1188; local_118c = local_118c + 1) {
        pdVar7 = TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffe840->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffe838,(int64_t)in_stack_ffffffffffffe830);
        dVar10 = *pdVar7;
        pdVar7 = TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffe840->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffe838,(int64_t)in_stack_ffffffffffffe830);
        dVar10 = dVar10 * *pdVar7;
        pdVar7 = TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffe840->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffe838,(int64_t)in_stack_ffffffffffffe830);
        *pdVar7 = dVar10;
        for (local_1544 = 0; local_1544 < 3; local_1544 = local_1544 + 1) {
          pdVar7 = TPZFMatrix<double>::operator()
                             (&in_stack_ffffffffffffe840->super_TPZFMatrix<double>,
                              (int64_t)in_stack_ffffffffffffe838,(int64_t)in_stack_ffffffffffffe830)
          ;
          dVar10 = *pdVar7;
          pdVar7 = TPZFMatrix<double>::operator()
                             (&in_stack_ffffffffffffe840->super_TPZFMatrix<double>,
                              (int64_t)in_stack_ffffffffffffe838,(int64_t)in_stack_ffffffffffffe830)
          ;
          in_stack_ffffffffffffe838 = *pdVar7;
          in_stack_ffffffffffffe840 =
               (TPZFNMatrix<100,_double> *)
               TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffe840->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffe838,(int64_t)in_stack_ffffffffffffe830);
          pp_Var11 = (in_stack_ffffffffffffe840->super_TPZFMatrix<double>).super_TPZMatrix<double>.
                     super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable;
          in_stack_ffffffffffffe830 =
               (TPZFMatrix<double> *)
               TPZFMatrix<double>::operator()
                         ((TPZFMatrix<double> *)in_stack_ffffffffffffe840,
                          (int64_t)in_stack_ffffffffffffe838,(int64_t)in_stack_ffffffffffffe830);
          dVar10 = dVar10 * in_stack_ffffffffffffe838 +
                   (double)pp_Var11 *
                   (double)(in_stack_ffffffffffffe830->super_TPZMatrix<double>).super_TPZBaseMatrix.
                           super_TPZSavable._vptr_TPZSavable;
          pdVar7 = TPZFMatrix<double>::operator()
                             (&in_stack_ffffffffffffe840->super_TPZFMatrix<double>,
                              (int64_t)in_stack_ffffffffffffe838,(int64_t)in_stack_ffffffffffffe830)
          ;
          *pdVar7 = dVar10;
        }
        local_7b8 = local_7b8 + 1;
      }
      TPZFNMatrix<40,_double>::~TPZFNMatrix((TPZFNMatrix<40,_double> *)0x1882144);
      TPZFNMatrix<40,_double>::~TPZFNMatrix((TPZFNMatrix<40,_double> *)0x1882151);
    }
    TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x1882169);
    TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x1882176);
  }
  return;
}

Assistant:

void TPZShapePiram::Shape(TPZVec<REAL> &pt, TPZVec<int64_t> &id, TPZVec<int> &order, TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {
		
		CornerShape(pt,phi,dphi);
		bool linear = true;
		int is,d;
        for(is=NCornerNodes; is<NSides; is++){
            if(order[is-NCornerNodes] > 1){
                linear = false;
            }
        }
		if(linear) return;
		
		TPZFNMatrix<100> phiblend(NSides,1),dphiblend(Dimension,NSides);
		for(is=0; is<NCornerNodes; is++)
		{
			phiblend(is,0) = phi(is,0);
			for(d=0; d<Dimension; d++)
			{
				dphiblend(d,is) = dphi(d,is);
			}
		}
		ShapeGenerating(pt,phiblend,dphiblend);
		//  if(order[13]<2) return;//order tem as ordens dos lados do elemento
		int shape = 5;
		//rib shapes
		for (int rib = 0; rib < 8; rib++) {//todas as arestas
			if (order[rib] <2 ) continue;
			REAL outval;
			ProjectPoint3dPiramToRib(rib,pt,outval);
			TPZVec<int64_t> ids(2);
			TPZManVector<REAL,1> outvalvec(1,outval);
			int id0,id1;
			id0 = SideNodes[rib][0];
			id1 = SideNodes[rib][1];
			ids[0] = id[id0];
			ids[1] = id[id1];
			REAL store1[20],store2[60];
			int nshape = order[rib]-1;//three orders : order in x , order in y and order in z
			TPZFMatrix<REAL> phin(nshape,1,store1,20),dphin(3,nshape,store2,60);
			phin.Zero();
			dphin.Zero();
			TPZShapeLinear::ShapeInternal(outvalvec,order[rib],phin,dphin,TPZShapeLinear::GetTransformId1d(ids));//ordin = ordem de um lado
			TransformDerivativeFromRibToPiram(rib,nshape,dphin);
			for (int i = 0; i < nshape; i++) {
				phi(shape,0) = phiblend(rib+5,0)*phin(i,0);
				for(int xj=0;xj<3;xj++) {
					dphi(xj,shape) = dphiblend(xj ,rib+5) * phin( i, 0) +
					phiblend(rib+5, 0 )  * dphin(xj,i);
				}
				shape++;
			}
		}

		for (int face = 0; face < 5; face++) {
			if (order[face+8] < 2) continue;
			if(face>0 && order[face+8]<=2) continue;//s� a face 13 tem shape associada com ordem p=2
			TPZManVector<REAL,2> outval(2);
			ProjectPoint3dPiramToFace(face,pt,outval);
			int ord1;//,ord2;
			ord1 = order[8+face];
			//ord2 = ord1;
			//FaceOrder(face,ord1,ord2);//ordem da face
			if(face && ord1<3) continue;//uma face com ordem < 3 n�o tem shape associada
			int nshape;
			if(!face) nshape = (ord1-1)*(ord1-1);//face quadrada
			else nshape = (ord1-2)*(ord1-1)/2;//face triangular
			TPZFNMatrix<60> phin(nshape,1),dphin(3,nshape);//ponto na face
			phin.Zero();
			dphin.Zero();
			TPZManVector<int64_t> ids(4);
			//	int id0,id1,id2;
			int i;
			if(!face) for(i=0;i<4;i++) ids[i] = id[FaceNodes[face][i]];
			else for(i=0;i<3;i++) ids[i] = id[FaceNodes[face][i]];
			//	id0 = ShapeFaceId[face][0];//indice das shapes da face que compoem a shape atual
			//	id1 = ShapeFaceId[face][1];//equivale a FaceIdsCube(face,ids,id,id0,id1);
			// 	id2 = ShapeFaceId[face][2];//if(face == 0) id3 = ShapeFaceId[face][3];
			int transid;
			if(!face) {
				transid = TPZShapeQuad::GetTransformId2dQ(ids);
				TPZShapeQuad::ShapeInternal(outval,ord1-2,phin,dphin,transid);//ordin = ordem de um lado
			} else {
				ids.Resize(3);
				transid = TPZShapeTriang::GetTransformId2dT(ids);
				outval[0] = (outval[0]+1.)/2.;//devido a corre��o na fun��o
				outval[1] = (outval[1]+1.)/2.;//Shape2dTriangleInternal(..) : correto aqui
				TPZShapeTriang::ShapeInternal(outval,ord1-2,phin,dphin,transid);//ordin = ordem de um lado
				int c = dphin.Cols();//isto da (p-2)(p-1)/2 ; ord1 = p ; correto aqui
				for(int i=0;i<c;i++) {
					dphin(0,i) /= 2.;//correcao da derivada OK! aqui
					dphin(1,i) /= 2.;
					dphin(2,i) /= 2.;
				}
			}
			TransformDerivativeFromFaceToPiram(face,nshape,dphin);//ordin = numero de shapes
			for(i=0;i<nshape;i++)	{
				phi(shape,0) = phiblend(face+13,0)*phin(i,0);//face quadril�teral
				for(int xj=0;xj<3;xj++) {
					dphi(xj,shape) = dphiblend(xj,face+13)* phin(i ,0) +
					phiblend(face+13, 0)*dphin(xj,i);
				}
				shape++;
			}
		}
		if(order[13]<3) return;//n�o h� ordens para cantos
		//volume shapes
		int nshape=0,i;
		for(i=0;i<order[13]-2;i++) {
			nshape += (i+1)*(i+2) / 2;
		}
		TPZFNMatrix<40> phin(nshape,1),dphin(3,nshape);
		phin.Zero();
		dphin.Zero();
		ShapeInternal(pt,order[13],phin,dphin);
		for(i=0;i<nshape;i++)	{
			phi(shape,0) = phiblend(NSides-1,0)*phin(i,0);
			for(int xj=0;xj<3;xj++) {
				dphi(xj,shape) = dphiblend(xj,NSides-1) * phin(i ,0) +
				phiblend(NSides-1, 0) * dphin(xj,i);
			}
			shape++;
		}
	}